

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O1

void __thiscall twitter::zipkin::thrift::Annotation::printTo(Annotation *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Annotation__isset _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Annotation(",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(out,"timestamp=",10);
  apache::thrift::to_string<long>(&local_48,&this->timestamp);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"value=",6);
  apache::thrift::to_string<std::__cxx11::string>(&local_48,(thrift *)&this->value,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"host=",5);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<twitter::zipkin::thrift::Endpoint>(&local_48,&this->host);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  }
  if ((((byte)_Var2 & 4) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1)) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void Annotation::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Annotation(";
  out << "timestamp=" << to_string(timestamp);
  out << ", " << "value=" << to_string(value);
  out << ", " << "host="; (__isset.host ? (out << to_string(host)) : (out << "<null>"));
  out << ")";
}